

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_ssg.cpp
# Opt level: O3

ssize_t __thiscall ymfm::ssg_engine::write(ssg_engine *this,int __fd,void *__buf,size_t __n)

{
  ssg_override *psVar1;
  ssize_t sVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  
  psVar1 = this->m_override;
  if (psVar1 != (ssg_override *)0x0) {
    sVar2 = (**(code **)(*(long *)psVar1 + 0x10))
                      (psVar1,CONCAT44(in_register_00000034,__fd),(ulong)__buf & 0xff,
                       *(code **)(*(long *)psVar1 + 0x10));
    return sVar2;
  }
  uVar3 = (ulong)(uint)__fd;
  (this->m_regs).m_regdata[(uint)__fd] = (uint8_t)__buf;
  if (__fd == 0xf) {
    if ((char)(this->m_regs).m_regdata[7] < '\0') {
      sVar2 = (*(code *)this->m_intf->m_engine[7]._vptr_ymfm_engine_callbacks)
                        (this->m_intf,0,1,(ulong)__buf & 0xff);
      return sVar2;
    }
  }
  else if (__fd == 0xe) {
    if (((this->m_regs).m_regdata[7] & 0x40) != 0) {
      sVar2 = (*(code *)this->m_intf->m_engine[7]._vptr_ymfm_engine_callbacks)
                        (this->m_intf,0,0,(ulong)__buf & 0xff);
      return sVar2;
    }
  }
  else if (__fd == 0xd) {
    this->m_envelope_state = 0;
    return uVar3;
  }
  return uVar3;
}

Assistant:

void ssg_engine::write(uint32_t regnum, uint8_t data)
{
	// defer to the override if present
	if (m_override != nullptr)
		return m_override->ssg_write(regnum, data);

	// store the raw value to the register array;
	// most writes are passive, consumed only when needed
	m_regs.write(regnum, data);

	// writes to the envelope shape register reset the state
	if (regnum == 0x0d)
		m_envelope_state = 0;

	// writes to the I/O ports call the handlers if they are configured for output
	else if (regnum == 0x0e && m_regs.io_a_out())
		m_intf.ymfm_external_write(ACCESS_IO, 0, data);
	else if (regnum == 0x0f && m_regs.io_b_out())
		m_intf.ymfm_external_write(ACCESS_IO, 1, data);
}